

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void * cmGetSource(void *arg,char *name)

{
  string *filename;
  cmSourceFile *pcVar1;
  iterator iVar2;
  cmCPluginAPISourceFile *this;
  _Base_ptr p_Var3;
  pair<std::_Rb_tree_iterator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>,_bool>
  pVar4;
  cmSourceFile *rsf;
  value_type entry;
  allocator<char> local_41;
  cmSourceFile *local_40;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,name,&local_41);
  pcVar1 = cmMakefile::GetSource((cmMakefile *)arg,&local_38,Ambiguous);
  std::__cxx11::string::~string((string *)&local_38);
  if (pcVar1 == (cmSourceFile *)0x0) {
    p_Var3 = (_Base_ptr)0x0;
  }
  else {
    local_40 = pcVar1;
    iVar2 = std::
            _Rb_tree<cmSourceFile_*,_std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>,_std::_Select1st<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
            ::find((_Rb_tree<cmSourceFile_*,_std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>,_std::_Select1st<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
                    *)&cmCPluginAPISourceFiles,&local_40);
    if ((_Rb_tree_header *)iVar2._M_node ==
        &cmCPluginAPISourceFiles.
         super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
         ._M_t._M_impl.super__Rb_tree_header) {
      this = (cmCPluginAPISourceFile *)operator_new(0xb0);
      cmCPluginAPISourceFile::cmCPluginAPISourceFile(this);
      this->RealSourceFile = local_40;
      cmSourceFile::GetFullPath(local_40,(string *)0x0);
      filename = &this->FullPath;
      std::__cxx11::string::_M_assign((string *)filename);
      cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_38,filename);
      std::__cxx11::string::operator=((string *)&this->SourceName,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      cmsys::SystemTools::GetFilenameLastExtension(&local_38,filename);
      std::__cxx11::string::operator=((string *)&this->SourceExtension,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      local_38._M_dataplus._M_p = (pointer)local_40;
      local_38._M_string_length = (size_type)this;
      pVar4 = std::
              _Rb_tree<cmSourceFile*,std::pair<cmSourceFile*const,cmCPluginAPISourceFile*>,std::_Select1st<std::pair<cmSourceFile*const,cmCPluginAPISourceFile*>>,std::less<cmSourceFile*>,std::allocator<std::pair<cmSourceFile*const,cmCPluginAPISourceFile*>>>
              ::_M_emplace_unique<std::pair<cmSourceFile*const,cmCPluginAPISourceFile*>&>
                        ((_Rb_tree<cmSourceFile*,std::pair<cmSourceFile*const,cmCPluginAPISourceFile*>,std::_Select1st<std::pair<cmSourceFile*const,cmCPluginAPISourceFile*>>,std::less<cmSourceFile*>,std::allocator<std::pair<cmSourceFile*const,cmCPluginAPISourceFile*>>>
                          *)&cmCPluginAPISourceFiles,
                         (pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*> *)&local_38);
      iVar2._M_node = (_Base_ptr)pVar4.first._M_node;
    }
    p_Var3 = iVar2._M_node[1]._M_parent;
  }
  return p_Var3;
}

Assistant:

void CCONV* cmGetSource(void* arg, const char* name)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  if (cmSourceFile* rsf = mf->GetSource(name)) {
    // Lookup the proxy source file object for this source.
    cmCPluginAPISourceFileMap::iterator i = cmCPluginAPISourceFiles.find(rsf);
    if (i == cmCPluginAPISourceFiles.end()) {
      // Create a proxy source file object for this source.
      cmCPluginAPISourceFile* sf = new cmCPluginAPISourceFile;
      sf->RealSourceFile = rsf;
      sf->FullPath = rsf->GetFullPath();
      sf->SourceName =
        cmSystemTools::GetFilenameWithoutLastExtension(sf->FullPath);
      sf->SourceExtension =
        cmSystemTools::GetFilenameLastExtension(sf->FullPath);

      // Store the proxy in the map so it can be re-used and deleted later.
      cmCPluginAPISourceFileMap::value_type entry(rsf, sf);
      i = cmCPluginAPISourceFiles.insert(entry).first;
    }
    return i->second;
  }
  return nullptr;
}